

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int *piVar2;
  mmk_verify_params local_1648;
  mmk_verify_params local_1620;
  mmk_verify_params local_15f8;
  mmk_verify_params local_15d0;
  mmk_verify_params local_15a8;
  mmk_verify_params local_1580;
  mmk_verify_params local_1558;
  mmk_verify_params local_1530;
  mmk_verify_params local_1508;
  mmk_verify_params local_14e0;
  mmk_verify_params local_14b8;
  mmk_verify_params local_1490;
  mmk_verify_params local_1468;
  mmk_verify_params local_1440;
  mmk_verify_params local_1418;
  mmk_verify_params local_13f0;
  mmk_verify_params local_13c8;
  mmk_verify_params local_13a0;
  mmk_verify_params local_1378;
  mmk_verify_params local_1350;
  mmk_verify_params local_1328;
  mmk_verify_params local_1300;
  mmk_verify_params local_12d8;
  mmk_verify_params local_12b0;
  mmk_verify_params local_1288;
  mmk_verify_params local_1260;
  mmk_verify_params local_1238;
  mmk_verify_params local_1210;
  mmk_verify_params local_11e8;
  mmk_verify_params local_11c0;
  mmk_verify_params local_1198;
  mmk_verify_params local_1170;
  mmk_verify_params local_1148;
  mmk_verify_params local_1120;
  mmk_verify_params local_10f8;
  mmk_verify_params local_10d0;
  mmk_verify_params local_10a8;
  mmk_verify_params local_1080;
  mmk_verify_params local_1058;
  mmk_verify_params local_1030;
  mmk_verify_params local_1008;
  mmk_verify_params local_fe0;
  mmk_verify_params local_fb8;
  mmk_verify_params local_f90;
  mmk_verify_params local_f68;
  mmk_verify_params local_f40;
  mmk_verify_params local_f18;
  mmk_verify_params local_ef0;
  mmk_verify_params local_ec8;
  mmk_verify_params local_ea0;
  mmk_verify_params local_e78;
  mmk_verify_params local_e50;
  mmk_verify_params local_e28;
  mmk_verify_params local_e00;
  mmk_verify_params local_dd8;
  mmk_verify_params local_db0;
  mmk_verify_params local_d88;
  mmk_verify_params local_d60;
  mmk_verify_params local_d38;
  mmk_verify_params local_d10;
  mmk_verify_params local_ce8;
  mmk_verify_params local_cc0;
  mmk_verify_params local_c98;
  mmk_verify_params local_c70;
  mmk_verify_params local_c48;
  mmk_verify_params local_c20;
  mmk_verify_params local_bf8;
  mmk_verify_params local_bd0;
  mmk_verify_params local_ba8;
  mmk_verify_params local_b80;
  mmk_verify_params local_b58;
  mmk_verify_params local_b30;
  mmk_verify_params local_b08;
  mmk_verify_params local_ae0;
  mmk_verify_params local_ab8;
  mmk_verify_params local_a90;
  mmk_verify_params local_a68;
  mmk_verify_params local_a40;
  mmk_verify_params local_a18;
  mmk_verify_params local_9f0;
  mmk_verify_params local_9c8;
  mmk_verify_params local_9a0;
  mmk_verify_params local_978;
  mmk_verify_params local_950;
  mmk_verify_params local_928;
  mmk_verify_params local_900;
  mmk_verify_params local_8d8;
  mmk_verify_params local_8b0;
  mmk_verify_params local_888;
  mmk_verify_params local_860;
  mmk_verify_params local_838;
  mmk_verify_params local_810;
  mmk_verify_params local_7e8;
  mmk_verify_params local_7c0;
  mmk_verify_params local_798;
  mmk_verify_params local_770;
  mmk_verify_params local_748;
  mmk_verify_params local_720;
  mmk_verify_params local_6f8;
  mmk_verify_params local_6d0;
  mmk_verify_params local_6a8;
  mmk_verify_params local_680;
  mmk_verify_params local_658;
  mmk_verify_params local_630;
  mmk_verify_params local_608;
  mmk_verify_params local_5e0;
  mmk_verify_params local_5b8;
  mmk_verify_params local_590;
  mmk_verify_params local_568;
  mmk_verify_params local_540;
  mmk_verify_params local_518;
  mmk_verify_params local_4f0;
  mmk_verify_params local_4c8;
  mmk_verify_params local_4a0;
  mmk_verify_params local_478;
  mmk_verify_params local_450;
  mmk_verify_params local_428;
  mmk_verify_params local_400;
  mmk_verify_params local_3d8;
  mmk_verify_params local_3b0;
  mmk_verify_params local_388;
  mmk_verify_params local_360;
  mmk_verify_params local_338;
  mmk_verify_params local_310;
  mmk_verify_params local_2e8;
  mmk_verify_params local_2c0;
  mmk_verify_params local_298;
  mmk_verify_params local_270;
  mmk_verify_params local_248;
  mmk_verify_params local_220;
  mmk_verify_params local_1f8;
  mmk_verify_params local_1d0;
  mmk_verify_params local_1a8;
  mmk_verify_params local_180;
  mmk_result local_158;
  mmk_result local_138;
  mmk_result local_118;
  mmk_result local_f8;
  mmk_result local_d8;
  mmk_result local_b8;
  mmk_result local_98;
  mmk_result local_78;
  mmk_result local_58;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  mmk_mock_create_internal("fn_vv",mmkuser_fn_vv_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_78.with_va = (mmk_va_info *)0x0;
  local_78.sentinel_ = 0;
  local_78.then_errno = 0;
  local_78.then_return = (void *)0x0;
  local_78.then_call = set_valid;
  mmk_when_init(&local_78);
  fn_vv();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x48);
  mmk_matcher_term();
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_1648.times = 0;
  local_1648.matching = (_func_int_size_t *)0x0;
  local_1648.at_least = 0;
  local_1648.at_most = 0;
  local_1648.sentinel_ = 1;
  local_1648.never = 1;
  iVar1 = mmk_verify_times(&local_1648);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"mmk_verify(fn_vv(), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_1620.sentinel_ = 1;
  local_1620._4_8_ = 0;
  local_1620._12_8_ = 0;
  local_1620.at_most._4_4_ = 0;
  local_1620.times = 1;
  local_1620.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1620);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"!mmk_verify(fn_vv(), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_15f8.sentinel_ = 1;
  local_15f8.never = 0;
  local_15f8.at_least = 0;
  local_15f8.at_most = 1;
  local_15f8.times = 0;
  local_15f8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15f8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"mmk_verify(fn_vv(), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4a);
  local_15d0.sentinel_ = 1;
  local_15d0.never = 0;
  local_15d0.at_least = 1;
  local_15d0.at_most = 0;
  local_15d0.times = 0;
  local_15d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15d0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4a
                ,"!mmk_verify(fn_vv(), .at_least = times + 1)");
    mmk_abort();
  }
  fn_vv();
  if (valid == '\0') {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4c
                ,"valid");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_15a8.sentinel_ = 1;
  local_15a8._4_8_ = 0;
  local_15a8._12_8_ = 0;
  local_15a8.at_most._4_4_ = 0;
  local_15a8.times = 1;
  local_15a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_15a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1580.sentinel_ = 1;
  local_1580.never = 0;
  local_1580.at_least = 1;
  local_1580.at_most = 0;
  local_1580.times = 0;
  local_1580.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1580);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1558.sentinel_ = 1;
  local_1558.never = 0;
  local_1558.at_least = 0;
  local_1558.at_most = 1;
  local_1558.times = 0;
  local_1558.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1558);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1530.sentinel_ = 1;
  local_1530.never = 0;
  local_1530.at_least = 1;
  local_1530.at_most = 1;
  local_1530.times = 0;
  local_1530.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1530);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1508.times = 0;
  local_1508.matching = (_func_int_size_t *)0x0;
  local_1508.at_least = 0;
  local_1508.at_most = 0;
  local_1508.sentinel_ = 1;
  local_1508.never = 1;
  iVar1 = mmk_verify_times(&local_1508);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_14e0.sentinel_ = 1;
  local_14e0._4_8_ = 0;
  local_14e0._12_8_ = 0;
  local_14e0.at_most._4_4_ = 0;
  local_14e0.times = 2;
  local_14e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14e0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_14b8.sentinel_ = 1;
  local_14b8.never = 0;
  local_14b8.at_least = 0;
  local_14b8.at_most = 2;
  local_14b8.times = 0;
  local_14b8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_14b8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"mmk_verify(fn_vv(), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_vv();
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x4d);
  local_1490.sentinel_ = 1;
  local_1490.never = 0;
  local_1490.at_least = 2;
  local_1490.at_most = 0;
  local_1490.times = 0;
  local_1490.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1490);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x4d
                ,"!mmk_verify(fn_vv(), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_reset(fn_vv);
  mmk_mock_create_internal("fn_ii",mmkuser_fn_ii_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_158.sentinel_ = 0;
  local_158.then_errno = -0x1010102;
  local_158.then_return = &local_38;
  local_38 = 1;
  local_158.then_call = (_func_void *)0x0;
  local_158.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_158);
  fn_ii(1);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x52);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_138.sentinel_ = 0;
  local_138.then_errno = -0x1010101;
  local_138.then_return = &local_34;
  local_34 = 2;
  local_138.then_call = (_func_void *)0x0;
  local_138.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_138);
  mmk_matcher_add(MMK_MATCHER_EQ,0);
  fn_ii(2);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x53);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_118.sentinel_ = 0;
  local_118.then_errno = -0x1010100;
  local_118.then_return = &local_30;
  local_30 = 3;
  local_118.then_call = (_func_void *)0x0;
  local_118.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_118);
  mmk_matcher_add(MMK_MATCHER_GEQ,1);
  fn_ii(3);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x54);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_f8.sentinel_ = 0;
  local_f8.then_errno = -0x10100ff;
  local_f8.then_return = &local_2c;
  local_2c = 4;
  local_f8.then_call = (_func_void *)0x0;
  local_f8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_f8);
  mmk_matcher_add(MMK_MATCHER_GT,2);
  fn_ii(4);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x55);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_d8.sentinel_ = 0;
  local_d8.then_errno = -0x10100fe;
  local_d8.then_return = &local_28;
  local_28 = 5;
  local_d8.then_call = (_func_void *)0x0;
  local_d8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_d8);
  mmk_matcher_add(MMK_MATCHER_LEQ,3);
  fn_ii(0xfffffffe);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x56);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_b8.sentinel_ = 0;
  local_b8.then_errno = -0x10100fd;
  local_b8.then_return = &local_24;
  local_24 = 6;
  local_b8.then_call = (_func_void *)0x0;
  local_b8.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_b8);
  mmk_matcher_add(MMK_MATCHER_LT,4);
  fn_ii(0xfffffffd);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x57);
  mmk_matcher_term();
  mmk_matcher_init(0);
  local_98.sentinel_ = 0;
  local_98.then_errno = -0x10100fc;
  local_98.then_return = &local_20;
  local_20 = 7;
  local_98.then_call = (_func_void *)0x0;
  local_98.with_va = (mmk_va_info *)0x0;
  mmk_when_init(&local_98);
  mmk_matcher_add_fn(MMK_MATCHER_THAT,5,int_eq);
  fn_ii(0);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x58);
  mmk_matcher_term();
  iVar1 = fn_ii(1);
  if (iVar1 == 1) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010102) goto LAB_00102bce;
  }
  else {
LAB_00102bce:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5a
                ,"fn_ii(1) == 1 && errno == err");
    mmk_abort();
  }
  iVar1 = fn_ii(2);
  if (iVar1 == 2) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010101) goto LAB_00102c1a;
  }
  else {
LAB_00102c1a:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5b
                ,"fn_ii(2) == 2 && errno == err + 1");
    mmk_abort();
  }
  iVar1 = fn_ii(3);
  if (iVar1 == 3) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010100) goto LAB_00102c66;
  }
  else {
LAB_00102c66:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5c
                ,"fn_ii(3) == 3 && errno == err + 2");
    mmk_abort();
  }
  iVar1 = fn_ii(4);
  if (iVar1 == 3) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x1010100) goto LAB_00102cb2;
  }
  else {
LAB_00102cb2:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5d
                ,"fn_ii(4) == 3 && errno == err + 2");
    mmk_abort();
  }
  iVar1 = fn_ii(5);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102cfe;
  }
  else {
LAB_00102cfe:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5e
                ,"fn_ii(5) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(6);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102d4a;
  }
  else {
LAB_00102d4a:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x5f
                ,"fn_ii(6) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(0x7fffffff);
  if (iVar1 == 4) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100ff) goto LAB_00102d96;
  }
  else {
LAB_00102d96:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x60
                ,"fn_ii(INT_MAX) == 4 && errno == err + 3");
    mmk_abort();
  }
  iVar1 = fn_ii(0xffffffff);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x61
                ,"fn_ii(-1) == 0");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffe);
  if (iVar1 == 5) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fe) goto LAB_00102e20;
  }
  else {
LAB_00102e20:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x62
                ,"fn_ii(-2) == 5 && errno == err + 4");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffd);
  if (iVar1 == 5) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fe) goto LAB_00102e6c;
  }
  else {
LAB_00102e6c:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",99,
                "fn_ii(-3) == 5 && errno == err + 4");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffc);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102eb8;
  }
  else {
LAB_00102eb8:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",100,
                "fn_ii(-4) == 6 && errno == err + 5");
    mmk_abort();
  }
  iVar1 = fn_ii(0xfffffffb);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102f04;
  }
  else {
LAB_00102f04:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x65
                ,"fn_ii(-5) == 6 && errno == err + 5");
    mmk_abort();
  }
  iVar1 = fn_ii(0x80000000);
  if (iVar1 == 6) {
    piVar2 = __errno_location();
    if (*piVar2 != -0x10100fd) goto LAB_00102f50;
  }
  else {
LAB_00102f50:
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x66
                ,"fn_ii(INT_MIN) == 6 && errno == err + 5");
    mmk_abort();
  }
  expected_int = 1;
  iVar1 = fn_ii(1);
  if (iVar1 == 7) {
    piVar2 = __errno_location();
    if ((*piVar2 == -0x10100fc) && ((int_eq_called & 1) != 0)) goto LAB_00102fdc;
  }
  mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x69,
              "fn_ii(1) == 7 && errno == err + 6 && int_eq_called");
  mmk_abort();
LAB_00102fdc:
  int_eq_called = 0;
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1468.sentinel_ = 1;
  local_1468._4_8_ = 0;
  local_1468._12_8_ = 0;
  local_1468.at_most._4_4_ = 0;
  local_1468.times = 0xe;
  local_1468.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1468);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1440.sentinel_ = 1;
  local_1440.never = 0;
  local_1440.at_least = 0xe;
  local_1440.at_most = 0;
  local_1440.times = 0;
  local_1440.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1440);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1418.sentinel_ = 1;
  local_1418.never = 0;
  local_1418.at_least = 0;
  local_1418.at_most = 0xe;
  local_1418.times = 0;
  local_1418.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1418);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_13f0.sentinel_ = 1;
  local_13f0.never = 0;
  local_13f0.at_least = 0xe;
  local_13f0.at_most = 0xe;
  local_13f0.times = 0;
  local_13f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_13f0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times, .at_most = times)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_13c8.times = 0;
  local_13c8.matching = (_func_int_size_t *)0x0;
  local_13c8.at_least = 0;
  local_13c8.at_most = 0;
  local_13c8.sentinel_ = 1;
  local_13c8.never = 1;
  iVar1 = mmk_verify_times(&local_13c8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .never = 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_13a0.sentinel_ = 1;
  local_13a0._4_8_ = 0;
  local_13a0._12_8_ = 0;
  local_13a0.at_most._4_4_ = 0;
  local_13a0.times = 0xd;
  local_13a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_13a0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1378.sentinel_ = 1;
  local_1378.never = 0;
  local_1378.at_least = 0xd;
  local_1378.at_most = 0;
  local_1378.times = 0;
  local_1378.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1378);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1350.sentinel_ = 1;
  local_1350.never = 0;
  local_1350.at_least = 0;
  local_1350.at_most = 0xd;
  local_1350.times = 0;
  local_1350.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1350);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times - 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1328.sentinel_ = 1;
  local_1328._4_8_ = 0;
  local_1328._12_8_ = 0;
  local_1328.at_most._4_4_ = 0;
  local_1328.times = 0xf;
  local_1328.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1328);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .times = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_1300.sentinel_ = 1;
  local_1300.never = 0;
  local_1300.at_least = 0;
  local_1300.at_most = 0xf;
  local_1300.times = 0;
  local_1300.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1300);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_most = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  mmk_matcher_add(MMK_MATCHER_ANY,6);
  fn_ii(0);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6c);
  local_12d8.sentinel_ = 1;
  local_12d8.never = 0;
  local_12d8.at_least = 0xf;
  local_12d8.at_most = 0;
  local_12d8.times = 0;
  local_12d8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12d8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6c
                ,
                "!mmk_verify(fn_ii((mmk_matcher_add(MMK_MATCHER_ANY, 6), ((int) { 0 }))), .at_least = times + 1)"
               );
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_12b0.sentinel_ = 1;
  local_12b0._4_8_ = 0;
  local_12b0._12_8_ = 0;
  local_12b0.at_most._4_4_ = 0;
  local_12b0.times = 2;
  local_12b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_12b0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1288.sentinel_ = 1;
  local_1288.never = 0;
  local_1288.at_least = 2;
  local_1288.at_most = 0;
  local_1288.times = 0;
  local_1288.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1288);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1260.sentinel_ = 1;
  local_1260.never = 0;
  local_1260.at_least = 0;
  local_1260.at_most = 2;
  local_1260.times = 0;
  local_1260.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1260);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1238.sentinel_ = 1;
  local_1238.never = 0;
  local_1238.at_least = 2;
  local_1238.at_most = 2;
  local_1238.times = 0;
  local_1238.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1238);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1210.times = 0;
  local_1210.matching = (_func_int_size_t *)0x0;
  local_1210.at_least = 0;
  local_1210.at_most = 0;
  local_1210.sentinel_ = 1;
  local_1210.never = 1;
  iVar1 = mmk_verify_times(&local_1210);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_11e8.sentinel_ = 1;
  local_11e8._4_8_ = 0;
  local_11e8._12_8_ = 0;
  local_11e8.at_most._4_4_ = 0;
  local_11e8.times = 1;
  local_11e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11e8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .times = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_11c0.sentinel_ = 1;
  local_11c0.never = 0;
  local_11c0.at_least = 1;
  local_11c0.at_most = 0;
  local_11c0.times = 0;
  local_11c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_11c0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_least = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1198.sentinel_ = 1;
  local_1198.never = 0;
  local_1198.at_least = 0;
  local_1198.at_most = 1;
  local_1198.times = 0;
  local_1198.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1198);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .at_most = times - 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1170.sentinel_ = 1;
  local_1170._4_8_ = 0;
  local_1170._12_8_ = 0;
  local_1170.at_most._4_4_ = 0;
  local_1170.times = 3;
  local_1170.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1170);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1148.sentinel_ = 1;
  local_1148.never = 0;
  local_1148.at_least = 0;
  local_1148.at_most = 3;
  local_1148.times = 0;
  local_1148.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1148);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"mmk_verify(fn_ii(1), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(1);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6d);
  local_1120.sentinel_ = 1;
  local_1120.never = 0;
  local_1120.at_least = 3;
  local_1120.at_most = 0;
  local_1120.times = 0;
  local_1120.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1120);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6d
                ,"!mmk_verify(fn_ii(1), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_10f8.sentinel_ = 1;
  local_10f8._4_8_ = 0;
  local_10f8._12_8_ = 0;
  local_10f8.at_most._4_4_ = 0;
  local_10f8.times = 1;
  local_10f8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10f8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_10d0.sentinel_ = 1;
  local_10d0.never = 0;
  local_10d0.at_least = 1;
  local_10d0.at_most = 0;
  local_10d0.times = 0;
  local_10d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10d0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_10a8.sentinel_ = 1;
  local_10a8.never = 0;
  local_10a8.at_least = 0;
  local_10a8.at_most = 1;
  local_10a8.times = 0;
  local_10a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_10a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1080.sentinel_ = 1;
  local_1080.never = 0;
  local_1080.at_least = 1;
  local_1080.at_most = 1;
  local_1080.times = 0;
  local_1080.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1080);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1058.times = 0;
  local_1058.matching = (_func_int_size_t *)0x0;
  local_1058.at_least = 0;
  local_1058.at_most = 0;
  local_1058.sentinel_ = 1;
  local_1058.never = 1;
  iVar1 = mmk_verify_times(&local_1058);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1030.sentinel_ = 1;
  local_1030._4_8_ = 0;
  local_1030._12_8_ = 0;
  local_1030.at_most._4_4_ = 0;
  local_1030.times = 2;
  local_1030.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1030);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_1008.sentinel_ = 1;
  local_1008.never = 0;
  local_1008.at_least = 0;
  local_1008.at_most = 2;
  local_1008.times = 0;
  local_1008.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1008);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"mmk_verify(fn_ii(2), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(2);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6e);
  local_fe0.sentinel_ = 1;
  local_fe0.never = 0;
  local_fe0.at_least = 2;
  local_fe0.at_most = 0;
  local_fe0.times = 0;
  local_fe0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_fe0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6e
                ,"!mmk_verify(fn_ii(2), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_fb8.sentinel_ = 1;
  local_fb8._4_8_ = 0;
  local_fb8._12_8_ = 0;
  local_fb8.at_most._4_4_ = 0;
  local_fb8.times = 1;
  local_fb8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_fb8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f90.sentinel_ = 1;
  local_f90.never = 0;
  local_f90.at_least = 1;
  local_f90.at_most = 0;
  local_f90.times = 0;
  local_f90.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f90);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f68.sentinel_ = 1;
  local_f68.never = 0;
  local_f68.at_least = 0;
  local_f68.at_most = 1;
  local_f68.times = 0;
  local_f68.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f68);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f40.sentinel_ = 1;
  local_f40.never = 0;
  local_f40.at_least = 1;
  local_f40.at_most = 1;
  local_f40.times = 0;
  local_f40.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_f40);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_f18.times = 0;
  local_f18.matching = (_func_int_size_t *)0x0;
  local_f18.at_least = 0;
  local_f18.at_most = 0;
  local_f18.sentinel_ = 1;
  local_f18.never = 1;
  iVar1 = mmk_verify_times(&local_f18);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_ef0.sentinel_ = 1;
  local_ef0._4_8_ = 0;
  local_ef0._12_8_ = 0;
  local_ef0.at_most._4_4_ = 0;
  local_ef0.times = 2;
  local_ef0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ef0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_ec8.sentinel_ = 1;
  local_ec8.never = 0;
  local_ec8.at_least = 0;
  local_ec8.at_most = 2;
  local_ec8.times = 0;
  local_ec8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ec8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"mmk_verify(fn_ii(3), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(3);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x6f);
  local_ea0.sentinel_ = 1;
  local_ea0.never = 0;
  local_ea0.at_least = 2;
  local_ea0.at_most = 0;
  local_ea0.times = 0;
  local_ea0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ea0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x6f
                ,"!mmk_verify(fn_ii(3), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e78.sentinel_ = 1;
  local_e78._4_8_ = 0;
  local_e78._12_8_ = 0;
  local_e78.at_most._4_4_ = 0;
  local_e78.times = 1;
  local_e78.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e78);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e50.sentinel_ = 1;
  local_e50.never = 0;
  local_e50.at_least = 1;
  local_e50.at_most = 0;
  local_e50.times = 0;
  local_e50.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e50);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e28.sentinel_ = 1;
  local_e28.never = 0;
  local_e28.at_least = 0;
  local_e28.at_most = 1;
  local_e28.times = 0;
  local_e28.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e28);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_e00.sentinel_ = 1;
  local_e00.never = 0;
  local_e00.at_least = 1;
  local_e00.at_most = 1;
  local_e00.times = 0;
  local_e00.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_e00);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_dd8.times = 0;
  local_dd8.matching = (_func_int_size_t *)0x0;
  local_dd8.at_least = 0;
  local_dd8.at_most = 0;
  local_dd8.sentinel_ = 1;
  local_dd8.never = 1;
  iVar1 = mmk_verify_times(&local_dd8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_db0.sentinel_ = 1;
  local_db0._4_8_ = 0;
  local_db0._12_8_ = 0;
  local_db0.at_most._4_4_ = 0;
  local_db0.times = 2;
  local_db0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_db0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_d88.sentinel_ = 1;
  local_d88.never = 0;
  local_d88.at_least = 0;
  local_d88.at_most = 2;
  local_d88.times = 0;
  local_d88.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d88);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"mmk_verify(fn_ii(4), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(4);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x70);
  local_d60.sentinel_ = 1;
  local_d60.never = 0;
  local_d60.at_least = 2;
  local_d60.at_most = 0;
  local_d60.times = 0;
  local_d60.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d60);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x70
                ,"!mmk_verify(fn_ii(4), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_d38.sentinel_ = 1;
  local_d38._4_8_ = 0;
  local_d38._12_8_ = 0;
  local_d38.at_most._4_4_ = 0;
  local_d38.times = 1;
  local_d38.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d38);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_d10.sentinel_ = 1;
  local_d10.never = 0;
  local_d10.at_least = 1;
  local_d10.at_most = 0;
  local_d10.times = 0;
  local_d10.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_d10);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_ce8.sentinel_ = 1;
  local_ce8.never = 0;
  local_ce8.at_least = 0;
  local_ce8.at_most = 1;
  local_ce8.times = 0;
  local_ce8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ce8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_cc0.sentinel_ = 1;
  local_cc0.never = 0;
  local_cc0.at_least = 1;
  local_cc0.at_most = 1;
  local_cc0.times = 0;
  local_cc0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_cc0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c98.times = 0;
  local_c98.matching = (_func_int_size_t *)0x0;
  local_c98.at_least = 0;
  local_c98.at_most = 0;
  local_c98.sentinel_ = 1;
  local_c98.never = 1;
  iVar1 = mmk_verify_times(&local_c98);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c70.sentinel_ = 1;
  local_c70._4_8_ = 0;
  local_c70._12_8_ = 0;
  local_c70.at_most._4_4_ = 0;
  local_c70.times = 2;
  local_c70.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c70);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c48.sentinel_ = 1;
  local_c48.never = 0;
  local_c48.at_least = 0;
  local_c48.at_most = 2;
  local_c48.times = 0;
  local_c48.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c48);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"mmk_verify(fn_ii(5), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(5);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x71);
  local_c20.sentinel_ = 1;
  local_c20.never = 0;
  local_c20.at_least = 2;
  local_c20.at_most = 0;
  local_c20.times = 0;
  local_c20.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_c20);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x71
                ,"!mmk_verify(fn_ii(5), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_bf8.sentinel_ = 1;
  local_bf8._4_8_ = 0;
  local_bf8._12_8_ = 0;
  local_bf8.at_most._4_4_ = 0;
  local_bf8.times = 1;
  local_bf8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_bf8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_bd0.sentinel_ = 1;
  local_bd0.never = 0;
  local_bd0.at_least = 1;
  local_bd0.at_most = 0;
  local_bd0.times = 0;
  local_bd0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_bd0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_ba8.sentinel_ = 1;
  local_ba8.never = 0;
  local_ba8.at_least = 0;
  local_ba8.at_most = 1;
  local_ba8.times = 0;
  local_ba8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ba8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b80.sentinel_ = 1;
  local_b80.never = 0;
  local_b80.at_least = 1;
  local_b80.at_most = 1;
  local_b80.times = 0;
  local_b80.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b80);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b58.times = 0;
  local_b58.matching = (_func_int_size_t *)0x0;
  local_b58.at_least = 0;
  local_b58.at_most = 0;
  local_b58.sentinel_ = 1;
  local_b58.never = 1;
  iVar1 = mmk_verify_times(&local_b58);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b30.sentinel_ = 1;
  local_b30._4_8_ = 0;
  local_b30._12_8_ = 0;
  local_b30.at_most._4_4_ = 0;
  local_b30.times = 2;
  local_b30.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b30);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_b08.sentinel_ = 1;
  local_b08.never = 0;
  local_b08.at_least = 0;
  local_b08.at_most = 2;
  local_b08.times = 0;
  local_b08.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_b08);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"mmk_verify(fn_ii(6), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(6);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x72);
  local_ae0.sentinel_ = 1;
  local_ae0.never = 0;
  local_ae0.at_least = 2;
  local_ae0.at_most = 0;
  local_ae0.times = 0;
  local_ae0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ae0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x72
                ,"!mmk_verify(fn_ii(6), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_ab8.sentinel_ = 1;
  local_ab8._4_8_ = 0;
  local_ab8._12_8_ = 0;
  local_ab8.at_most._4_4_ = 0;
  local_ab8.times = 1;
  local_ab8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_ab8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a90.sentinel_ = 1;
  local_a90.never = 0;
  local_a90.at_least = 1;
  local_a90.at_most = 0;
  local_a90.times = 0;
  local_a90.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a90);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a68.sentinel_ = 1;
  local_a68.never = 0;
  local_a68.at_least = 0;
  local_a68.at_most = 1;
  local_a68.times = 0;
  local_a68.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a68);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a40.sentinel_ = 1;
  local_a40.never = 0;
  local_a40.at_least = 1;
  local_a40.at_most = 1;
  local_a40.times = 0;
  local_a40.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_a40);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_a18.times = 0;
  local_a18.matching = (_func_int_size_t *)0x0;
  local_a18.at_least = 0;
  local_a18.at_most = 0;
  local_a18.sentinel_ = 1;
  local_a18.never = 1;
  iVar1 = mmk_verify_times(&local_a18);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_9f0.sentinel_ = 1;
  local_9f0._4_8_ = 0;
  local_9f0._12_8_ = 0;
  local_9f0.at_most._4_4_ = 0;
  local_9f0.times = 2;
  local_9f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9f0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_9c8.sentinel_ = 1;
  local_9c8.never = 0;
  local_9c8.at_least = 0;
  local_9c8.at_most = 2;
  local_9c8.times = 0;
  local_9c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"mmk_verify(fn_ii(2147483647), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x7fffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x73);
  local_9a0.sentinel_ = 1;
  local_9a0.never = 0;
  local_9a0.at_least = 2;
  local_9a0.at_most = 0;
  local_9a0.times = 0;
  local_9a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_9a0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x73
                ,"!mmk_verify(fn_ii(2147483647), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_978.sentinel_ = 1;
  local_978._4_8_ = 0;
  local_978._12_8_ = 0;
  local_978.at_most._4_4_ = 0;
  local_978.times = 1;
  local_978.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_978);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_950.sentinel_ = 1;
  local_950.never = 0;
  local_950.at_least = 1;
  local_950.at_most = 0;
  local_950.times = 0;
  local_950.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_950);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_928.sentinel_ = 1;
  local_928.never = 0;
  local_928.at_least = 0;
  local_928.at_most = 1;
  local_928.times = 0;
  local_928.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_928);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_900.sentinel_ = 1;
  local_900.never = 0;
  local_900.at_least = 1;
  local_900.at_most = 1;
  local_900.times = 0;
  local_900.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_900);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_8d8.times = 0;
  local_8d8.matching = (_func_int_size_t *)0x0;
  local_8d8.at_least = 0;
  local_8d8.at_most = 0;
  local_8d8.sentinel_ = 1;
  local_8d8.never = 1;
  iVar1 = mmk_verify_times(&local_8d8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_8b0.sentinel_ = 1;
  local_8b0._4_8_ = 0;
  local_8b0._12_8_ = 0;
  local_8b0.at_most._4_4_ = 0;
  local_8b0.times = 2;
  local_8b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_8b0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_888.sentinel_ = 1;
  local_888.never = 0;
  local_888.at_least = 0;
  local_888.at_most = 2;
  local_888.times = 0;
  local_888.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_888);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"mmk_verify(fn_ii(-1), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xffffffff);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x74);
  local_860.sentinel_ = 1;
  local_860.never = 0;
  local_860.at_least = 2;
  local_860.at_most = 0;
  local_860.times = 0;
  local_860.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_860);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x74
                ,"!mmk_verify(fn_ii(-1), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_838.sentinel_ = 1;
  local_838._4_8_ = 0;
  local_838._12_8_ = 0;
  local_838.at_most._4_4_ = 0;
  local_838.times = 1;
  local_838.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_838);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_810.sentinel_ = 1;
  local_810.never = 0;
  local_810.at_least = 1;
  local_810.at_most = 0;
  local_810.times = 0;
  local_810.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_810);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_7e8.sentinel_ = 1;
  local_7e8.never = 0;
  local_7e8.at_least = 0;
  local_7e8.at_most = 1;
  local_7e8.times = 0;
  local_7e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_7e8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_7c0.sentinel_ = 1;
  local_7c0.never = 0;
  local_7c0.at_least = 1;
  local_7c0.at_most = 1;
  local_7c0.times = 0;
  local_7c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_7c0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_798.times = 0;
  local_798.matching = (_func_int_size_t *)0x0;
  local_798.at_least = 0;
  local_798.at_most = 0;
  local_798.sentinel_ = 1;
  local_798.never = 1;
  iVar1 = mmk_verify_times(&local_798);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_770.sentinel_ = 1;
  local_770._4_8_ = 0;
  local_770._12_8_ = 0;
  local_770.at_most._4_4_ = 0;
  local_770.times = 2;
  local_770.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_770);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_748.sentinel_ = 1;
  local_748.never = 0;
  local_748.at_least = 0;
  local_748.at_most = 2;
  local_748.times = 0;
  local_748.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_748);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"mmk_verify(fn_ii(-2), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffe);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x75);
  local_720.sentinel_ = 1;
  local_720.never = 0;
  local_720.at_least = 2;
  local_720.at_most = 0;
  local_720.times = 0;
  local_720.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_720);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x75
                ,"!mmk_verify(fn_ii(-2), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_6f8.sentinel_ = 1;
  local_6f8._4_8_ = 0;
  local_6f8._12_8_ = 0;
  local_6f8.at_most._4_4_ = 0;
  local_6f8.times = 1;
  local_6f8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6f8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_6d0.sentinel_ = 1;
  local_6d0.never = 0;
  local_6d0.at_least = 1;
  local_6d0.at_most = 0;
  local_6d0.times = 0;
  local_6d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6d0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_6a8.sentinel_ = 1;
  local_6a8.never = 0;
  local_6a8.at_least = 0;
  local_6a8.at_most = 1;
  local_6a8.times = 0;
  local_6a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_6a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_680.sentinel_ = 1;
  local_680.never = 0;
  local_680.at_least = 1;
  local_680.at_most = 1;
  local_680.times = 0;
  local_680.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_680);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_658.times = 0;
  local_658.matching = (_func_int_size_t *)0x0;
  local_658.at_least = 0;
  local_658.at_most = 0;
  local_658.sentinel_ = 1;
  local_658.never = 1;
  iVar1 = mmk_verify_times(&local_658);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_630.sentinel_ = 1;
  local_630._4_8_ = 0;
  local_630._12_8_ = 0;
  local_630.at_most._4_4_ = 0;
  local_630.times = 2;
  local_630.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_630);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_608.sentinel_ = 1;
  local_608.never = 0;
  local_608.at_least = 0;
  local_608.at_most = 2;
  local_608.times = 0;
  local_608.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_608);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"mmk_verify(fn_ii(-3), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffd);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x76);
  local_5e0.sentinel_ = 1;
  local_5e0.never = 0;
  local_5e0.at_least = 2;
  local_5e0.at_most = 0;
  local_5e0.times = 0;
  local_5e0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5e0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x76
                ,"!mmk_verify(fn_ii(-3), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_5b8.sentinel_ = 1;
  local_5b8._4_8_ = 0;
  local_5b8._12_8_ = 0;
  local_5b8.at_most._4_4_ = 0;
  local_5b8.times = 1;
  local_5b8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_5b8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_590.sentinel_ = 1;
  local_590.never = 0;
  local_590.at_least = 1;
  local_590.at_most = 0;
  local_590.times = 0;
  local_590.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_590);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_568.sentinel_ = 1;
  local_568.never = 0;
  local_568.at_least = 0;
  local_568.at_most = 1;
  local_568.times = 0;
  local_568.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_568);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_540.sentinel_ = 1;
  local_540.never = 0;
  local_540.at_least = 1;
  local_540.at_most = 1;
  local_540.times = 0;
  local_540.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_540);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_518.times = 0;
  local_518.matching = (_func_int_size_t *)0x0;
  local_518.at_least = 0;
  local_518.at_most = 0;
  local_518.sentinel_ = 1;
  local_518.never = 1;
  iVar1 = mmk_verify_times(&local_518);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_4f0.sentinel_ = 1;
  local_4f0._4_8_ = 0;
  local_4f0._12_8_ = 0;
  local_4f0.at_most._4_4_ = 0;
  local_4f0.times = 2;
  local_4f0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4f0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_4c8.sentinel_ = 1;
  local_4c8.never = 0;
  local_4c8.at_least = 0;
  local_4c8.at_most = 2;
  local_4c8.times = 0;
  local_4c8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4c8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"mmk_verify(fn_ii(-4), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x77);
  local_4a0.sentinel_ = 1;
  local_4a0.never = 0;
  local_4a0.at_least = 2;
  local_4a0.at_most = 0;
  local_4a0.times = 0;
  local_4a0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_4a0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x77
                ,"!mmk_verify(fn_ii(-4), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_478.sentinel_ = 1;
  local_478._4_8_ = 0;
  local_478._12_8_ = 0;
  local_478.at_most._4_4_ = 0;
  local_478.times = 1;
  local_478.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_478);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_450.sentinel_ = 1;
  local_450.never = 0;
  local_450.at_least = 1;
  local_450.at_most = 0;
  local_450.times = 0;
  local_450.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_450);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_428.sentinel_ = 1;
  local_428.never = 0;
  local_428.at_least = 0;
  local_428.at_most = 1;
  local_428.times = 0;
  local_428.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_428);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_400.sentinel_ = 1;
  local_400.never = 0;
  local_400.at_least = 1;
  local_400.at_most = 1;
  local_400.times = 0;
  local_400.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_400);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_3d8.times = 0;
  local_3d8.matching = (_func_int_size_t *)0x0;
  local_3d8.at_least = 0;
  local_3d8.at_most = 0;
  local_3d8.sentinel_ = 1;
  local_3d8.never = 1;
  iVar1 = mmk_verify_times(&local_3d8);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_3b0.sentinel_ = 1;
  local_3b0._4_8_ = 0;
  local_3b0._12_8_ = 0;
  local_3b0.at_most._4_4_ = 0;
  local_3b0.times = 2;
  local_3b0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_3b0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_388.sentinel_ = 1;
  local_388.never = 0;
  local_388.at_least = 0;
  local_388.at_most = 2;
  local_388.times = 0;
  local_388.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_388);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"mmk_verify(fn_ii(-5), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xfffffffb);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x78);
  local_360.sentinel_ = 1;
  local_360.never = 0;
  local_360.at_least = 2;
  local_360.at_most = 0;
  local_360.times = 0;
  local_360.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_360);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x78
                ,"!mmk_verify(fn_ii(-5), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_338.sentinel_ = 1;
  local_338._4_8_ = 0;
  local_338._12_8_ = 0;
  local_338.at_most._4_4_ = 0;
  local_338.times = 1;
  local_338.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_338);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .times = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_310.sentinel_ = 1;
  local_310.never = 0;
  local_310.at_least = 1;
  local_310.at_most = 0;
  local_310.times = 0;
  local_310.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_310);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_least = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_2e8.sentinel_ = 1;
  local_2e8.never = 0;
  local_2e8.at_least = 0;
  local_2e8.at_most = 1;
  local_2e8.times = 0;
  local_2e8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_2e8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_2c0.sentinel_ = 1;
  local_2c0.never = 0;
  local_2c0.at_least = 1;
  local_2c0.at_most = 1;
  local_2c0.times = 0;
  local_2c0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_2c0);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_least = times, .at_most = times)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_298.times = 0;
  local_298.matching = (_func_int_size_t *)0x0;
  local_298.at_least = 0;
  local_298.at_most = 0;
  local_298.sentinel_ = 1;
  local_298.never = 1;
  iVar1 = mmk_verify_times(&local_298);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_270.sentinel_ = 1;
  local_270._4_8_ = 0;
  local_270._12_8_ = 0;
  local_270.at_most._4_4_ = 0;
  local_270.times = 2;
  local_270.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_270);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_248.sentinel_ = 1;
  local_248.never = 0;
  local_248.at_least = 0;
  local_248.at_most = 2;
  local_248.times = 0;
  local_248.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_248);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"mmk_verify(fn_ii((-2147483647 -1)), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0x80000000);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x79);
  local_220.sentinel_ = 1;
  local_220.never = 0;
  local_220.at_least = 2;
  local_220.at_most = 0;
  local_220.times = 0;
  local_220.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_220);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x79
                ,"!mmk_verify(fn_ii((-2147483647 -1)), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_1f8.times = 0;
  local_1f8.matching = (_func_int_size_t *)0x0;
  local_1f8.at_least = 0;
  local_1f8.at_most = 0;
  local_1f8.sentinel_ = 1;
  local_1f8.never = 1;
  iVar1 = mmk_verify_times(&local_1f8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"mmk_verify(fn_ii(12), .never = 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_1d0.sentinel_ = 1;
  local_1d0._4_8_ = 0;
  local_1d0._12_8_ = 0;
  local_1d0.at_most._4_4_ = 0;
  local_1d0.times = 1;
  local_1d0.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1d0);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"!mmk_verify(fn_ii(12), .times = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_1a8.sentinel_ = 1;
  local_1a8.never = 0;
  local_1a8.at_least = 0;
  local_1a8.at_most = 1;
  local_1a8.times = 0;
  local_1a8.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_1a8);
  if (iVar1 == 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"mmk_verify(fn_ii(12), .at_most = times + 1)");
    mmk_abort();
  }
  mmk_matcher_init(1);
  fn_ii(0xc);
  mmk_matcher_term();
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7a);
  local_180.sentinel_ = 1;
  local_180.never = 0;
  local_180.at_least = 1;
  local_180.at_most = 0;
  local_180.times = 0;
  local_180.matching = (_func_int_size_t *)0x0;
  iVar1 = mmk_verify_times(&local_180);
  if (iVar1 != 0) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x7a
                ,"!mmk_verify(fn_ii(12), .at_least = times + 1)");
    mmk_abort();
  }
  mmk_reset(fn_ii);
  mmk_mock_create_internal("fn_ii_va",mmkuser_fn_ii_va_mock_stub,(mmk_mock_options)0x1);
  mmk_matcher_init(0);
  local_58.sentinel_ = 0;
  local_58.then_errno = 0;
  local_58.then_call = (_func_void *)0x0;
  local_58.with_va = (mmk_va_info *)0x0;
  local_58.then_return = &local_1c;
  local_1c = 1;
  mmk_when_init(&local_58);
  fn_ii_va(1,0x2a);
  mmk_mock_reset_call("/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c"
                      ,0x7f);
  mmk_matcher_term();
  iVar1 = fn_ii_va(1,0x2a);
  if (iVar1 != 1) {
    mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/test/test.c",0x81
                ,"fn_ii_va(1, 42) == 1");
    mmk_abort();
  }
  mmk_reset(fn_ii_va);
  return 0;
}

Assistant:

int main(void)
{
    mmk_mock("fn_vv", fn_vv_mock);
    mmk_when(fn_vv(), .then_call = (mmk_fn) set_valid);

    check_called_exact(fn_vv(), 0);
    fn_vv();
    mmk_assert(valid);
    check_called_exact(fn_vv(), 1);
    mmk_reset(fn_vv);

    int err = 0xfefefefe;
    mmk_mock("fn_ii", fn_ii_mock);
    mmk_when(fn_ii(1), .then_return = mmk_val(int, 1), .then_errno = err);
    mmk_when(fn_ii(mmk_eq(int, 2)), .then_return = mmk_val(int, 2), .then_errno = err + 1);
    mmk_when(fn_ii(mmk_ge(int, 3)), .then_return = mmk_val(int, 3), .then_errno = err + 2);
    mmk_when(fn_ii(mmk_gt(int, 4)), .then_return = mmk_val(int, 4), .then_errno = err + 3);
    mmk_when(fn_ii(mmk_le(int, -2)), .then_return = mmk_val(int, 5), .then_errno = err + 4);
    mmk_when(fn_ii(mmk_lt(int, -3)), .then_return = mmk_val(int, 6), .then_errno = err + 5);
    mmk_when(fn_ii(mmk_that(int, int_eq)), .then_return = mmk_val(int, 7), .then_errno = err + 6);

    mmk_assert(fn_ii(1) == 1 && errno == err);
    mmk_assert(fn_ii(2) == 2 && errno == err + 1);
    mmk_assert(fn_ii(3) == 3 && errno == err + 2);
    mmk_assert(fn_ii(4) == 3 && errno == err + 2);
    mmk_assert(fn_ii(5) == 4 && errno == err + 3);
    mmk_assert(fn_ii(6) == 4 && errno == err + 3);
    mmk_assert(fn_ii(INT_MAX)  == 4 && errno == err + 3);
    mmk_assert(fn_ii(-1) == 0);
    mmk_assert(fn_ii(-2) == 5 && errno == err + 4);
    mmk_assert(fn_ii(-3) == 5 && errno == err + 4);
    mmk_assert(fn_ii(-4) == 6 && errno == err + 5);
    mmk_assert(fn_ii(-5) == 6 && errno == err + 5);
    mmk_assert(fn_ii(INT_MIN) == 6 && errno == err + 5);

    expected_int = 1;
    mmk_assert(fn_ii(1) == 7 && errno == err + 6 && int_eq_called);
    int_eq_called = 0;

    check_called_exact(fn_ii(mmk_any(int)), 14);
    check_called_exact(fn_ii(1), 2);
    check_called_exact(fn_ii(2), 1);
    check_called_exact(fn_ii(3), 1);
    check_called_exact(fn_ii(4), 1);
    check_called_exact(fn_ii(5), 1);
    check_called_exact(fn_ii(6), 1);
    check_called_exact(fn_ii(INT_MAX), 1);
    check_called_exact(fn_ii(-1), 1);
    check_called_exact(fn_ii(-2), 1);
    check_called_exact(fn_ii(-3), 1);
    check_called_exact(fn_ii(-4), 1);
    check_called_exact(fn_ii(-5), 1);
    check_called_exact(fn_ii(INT_MIN), 1);
    check_called_exact(fn_ii(12), 0);
    mmk_reset(fn_ii);


    mmk_mock("fn_ii_va", fn_ii_va_mock);
    mmk_when(fn_ii_va(1, 42), .then_return = mmk_val(int, 1));

    mmk_assert(fn_ii_va(1, 42) == 1);

    mmk_reset(fn_ii_va);

    return 0;
}